

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChakraRtInterface.cpp
# Opt level: O0

HRESULT ChakraRTInterface::ParseConfigFlags(void)

{
  PAL_FILE *pPVar1;
  BSTR local_18;
  char16 *fileNameWide;
  HRESULT hr;
  
  fileNameWide._0_4_ = 0;
  if (m_testHooks.pfSetAssertToConsoleFlag != (SetAssertToConsoleFlagPtr)0x0) {
    SetAssertToConsoleFlag(true);
  }
  if (((m_testHooks.pfSetConfigFlags != (SetConfigFlagsPtr)0x0) &&
      (fileNameWide._0_4_ =
            SetConfigFlags(m_argInfo->argc,m_argInfo->argv,
                           &HostConfigFlags::flags.super_ICustomConfigFlags),
      (HRESULT)fileNameWide != 0)) && ((m_usageStringPrinted & 1U) == 0)) {
    (*m_argInfo->hostPrintUsage)();
    m_usageStringPrinted = true;
  }
  if ((HRESULT)fileNameWide == 0) {
    m_argInfo->filename = (char *)0x0;
    if (m_testHooks.pfGetFilenameFlag == (_func_HRESULT_BSTR_ptr *)0x0) {
      pPVar1 = PAL_get_stderr(0);
      PAL_fprintf(pPVar1,"ASSERTION (%s, line %d) %s %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/ChakraRtInterface.cpp"
                  ,0x107,"m_testHooks.pfGetFilenameFlag != nullptr");
      pPVar1 = PAL_get_stderr(0);
      PAL_fflush(pPVar1);
      DebugBreak();
    }
    local_18 = (LPCWSTR)0x0;
    fileNameWide._0_4_ = GetFileNameFlag(&local_18);
    if ((HRESULT)fileNameWide == 0) {
      fileNameWide._0_4_ = utf8::WideStringToNarrowDynamic(local_18,&m_argInfo->filename);
      SysFreeString(local_18);
      if ((HRESULT)fileNameWide < 0) {
        if ((HRESULT)fileNameWide != -0x7ff8fff2) {
          pPVar1 = PAL_get_stderr(0);
          PAL_fprintf(pPVar1,"ASSERTION (%s, line %d) %s %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/ChakraRtInterface.cpp"
                      ,0x118,"hr == ((HRESULT)0x8007000EL)","hr == E_OUTOFMEMORY");
          pPVar1 = PAL_get_stderr(0);
          PAL_fflush(pPVar1);
          DebugBreak();
        }
        PAL_wprintf(L"Error: Ran out of memory");
        return (HRESULT)fileNameWide;
      }
    }
    else {
      PAL_wprintf(L"Error: no script file specified.");
      (*m_argInfo->hostPrintUsage)();
      m_usageStringPrinted = true;
    }
  }
  return 0;
}

Assistant:

HRESULT ChakraRTInterface::ParseConfigFlags()
{
    HRESULT hr = S_OK;

    if (m_testHooks.pfSetAssertToConsoleFlag)
    {
        SetAssertToConsoleFlag(true);
    }

    if (m_testHooks.pfSetConfigFlags)
    {
        hr = SetConfigFlags(m_argInfo->argc, m_argInfo->argv, &HostConfigFlags::flags);
        if (hr != S_OK && !m_usageStringPrinted)
        {
            m_argInfo->hostPrintUsage();
            m_usageStringPrinted = true;
        }
    }

    if (hr == S_OK)
    {
        m_argInfo->filename = nullptr;
        Assert(m_testHooks.pfGetFilenameFlag != nullptr);

        char16* fileNameWide = nullptr;
        hr = GetFileNameFlag(&fileNameWide);

        if (hr != S_OK)
        {
            wprintf(_u("Error: no script file specified."));
            m_argInfo->hostPrintUsage();
            m_usageStringPrinted = true;
        }
        else
        {
            hr = WideStringToNarrowDynamic(fileNameWide, &m_argInfo->filename);
            SysFreeString(fileNameWide);
            if (FAILED(hr))
            {
                Assert(hr == E_OUTOFMEMORY);
                wprintf(_u("Error: Ran out of memory"));
                return hr;
            }
        }
    }

    return S_OK;
}